

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev.c
# Opt level: O2

void periodic_recalc(ev_loop *loop,ev_periodic *w)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  bool bVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar6 = w->offset;
  dVar1 = w->interval;
  dVar7 = dVar1;
  if (dVar1 <= 0.0001220703125) {
    dVar7 = 0.0001220703125;
  }
  dVar2 = loop->ev_rt_now;
  dVar5 = floor((dVar2 - dVar6) / dVar7);
  dVar6 = dVar5 * dVar7 + dVar6;
  do {
    dVar7 = dVar6;
    if (dVar2 < dVar6) break;
    dVar5 = dVar1 + dVar6;
    bVar3 = NAN(dVar6);
    bVar4 = dVar5 != dVar6;
    dVar6 = dVar5;
  } while ((bVar4) || (dVar7 = dVar2, NAN(dVar5) || bVar3));
  w->at = dVar7;
  return;
}

Assistant:

static void noinline
periodic_recalc (EV_P_ ev_periodic *w)
{
  ev_tstamp interval = w->interval > MIN_INTERVAL ? w->interval : MIN_INTERVAL;
  ev_tstamp at = w->offset + interval * ev_floor ((ev_rt_now - w->offset) / interval);

  /* the above almost always errs on the low side */
  while (at <= ev_rt_now)
    {
      ev_tstamp nat = at + w->interval;

      /* when resolution fails us, we use ev_rt_now */
      if (expect_false (nat == at))
        {
          at = ev_rt_now;
          break;
        }

      at = nat;
    }

  ev_at (w) = at;
}